

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chebyshev_polynomial.cpp
# Opt level: O0

double * u_mass_matrix(int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  ulong uVar4;
  double *t;
  double *w_00;
  double *b;
  double *a_00;
  double *pdVar5;
  double *x;
  double *w;
  double *phiw;
  double *phi;
  int k;
  int i;
  double *a;
  int n_local;
  
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)(n + 1);
  uVar4 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  t = (double *)operator_new__(uVar4);
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)(n + 1);
  uVar4 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  w_00 = (double *)operator_new__(uVar4);
  u_quadrature_rule(n + 1,t,w_00);
  b = u_polynomial(n + 1,n,t);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)((n + 1) * (n + 1));
  uVar4 = SUB168(auVar3 * ZEXT816(8),0);
  if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
    uVar4 = 0xffffffffffffffff;
  }
  a_00 = (double *)operator_new__(uVar4);
  for (phi._0_4_ = 0; (int)phi <= n; phi._0_4_ = (int)phi + 1) {
    for (phi._4_4_ = 0; phi._4_4_ <= n; phi._4_4_ = phi._4_4_ + 1) {
      a_00[phi._4_4_ + (int)phi * (n + 1)] = w_00[(int)phi] * b[(int)phi + phi._4_4_ * (n + 1)];
    }
  }
  pdVar5 = r8mat_mm_new(n + 1,n + 1,n + 1,a_00,b);
  if (b != (double *)0x0) {
    operator_delete__(b);
  }
  if (a_00 != (double *)0x0) {
    operator_delete__(a_00);
  }
  if (w_00 != (double *)0x0) {
    operator_delete__(w_00);
  }
  if (t != (double *)0x0) {
    operator_delete__(t);
  }
  return pdVar5;
}

Assistant:

double *u_mass_matrix ( int n )

//****************************************************************************80
//
//  Purpose:
//
//    U_MASS_MATRIX computes the mass matrix for the Chebyshev U polynomial.
//
//  Licensing:
//
//    This code is distributed under the GNU LGPL license.
//
//  Modified:
//
//    14 July 2015
//
//  Author:
//
//    John Burkardt
//
{
  double *a;
  int i;
  int k;
  double *phi;
  double *phiw;
  double *w;
  double *x;

  x = new double[n+1];
  w = new double[n+1];

  u_quadrature_rule ( n + 1, x, w );

  phi = u_polynomial ( n + 1, n, x );

  phiw = new double[(n+1)*(n+1)];

  for ( k = 0; k <= n; k++ )
  {
    for ( i = 0; i <= n; i++ )
    {
      phiw[i+k*(n+1)] = w[k] * phi[k+i*(n+1)];
    }
  }

  a = r8mat_mm_new ( n + 1, n + 1, n + 1, phiw, phi );
//
//  Free memory.
//
  delete [] phi;
  delete [] phiw;
  delete [] w;
  delete [] x;

  return a;
}